

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_attr_get_user(exr_const_context_t ctxt,int part_index,char *name,char **type,int32_t *size,
                 void **out)

{
  char *in_RCX;
  exr_attribute_list_t *in_RDX;
  uint in_ESI;
  _internal_exr_context *in_RDI;
  exr_attribute_t **in_R8;
  undefined8 *in_R9;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_attribute_t *attr;
  _internal_exr_part *p_Var1;
  long local_40;
  undefined4 in_stack_ffffffffffffffe8;
  exr_result_t local_4;
  
  if (in_RDI == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else {
    if (in_RDI->mode == '\x01') {
      internal_exr_lock(in_RDI);
    }
    if (((int)in_ESI < 0) || (in_RDI->num_parts <= (int)in_ESI)) {
      if (in_RDI->mode == '\x01') {
        internal_exr_unlock(in_RDI);
      }
      local_4 = (*in_RDI->print_error)(in_RDI,4,"Part index (%d) out of range",(ulong)in_ESI);
    }
    else {
      p_Var1 = in_RDI->parts[(int)in_ESI];
      if ((in_RDX == (exr_attribute_list_t *)0x0) || ((char)in_RDX->num_attributes == '\0')) {
        if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
        local_4 = (*in_RDI->report_error)(in_RDI,3,"Invalid name for opaque attribute query");
      }
      else {
        local_4 = exr_attr_list_find_by_name
                            ((exr_const_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                             in_RCX,in_R8);
        if (local_4 == 0) {
          if (*(int *)(local_40 + 0x14) == 0x1d) {
            if (in_RCX != (char *)0x0) {
              *(undefined8 *)in_RCX = *(undefined8 *)(local_40 + 8);
            }
            if (*(long *)(*(long *)(local_40 + 0x18) + 0x28) == 0) {
              if (in_R8 != (exr_attribute_t **)0x0) {
                *(undefined4 *)in_R8 = *(undefined4 *)(*(long *)(local_40 + 0x18) + 8);
              }
              if (in_R9 != (undefined8 *)0x0) {
                *in_R9 = *(undefined8 *)(*(long *)(local_40 + 0x18) + 0x10);
              }
            }
            else {
              if (in_R8 != (exr_attribute_t **)0x0) {
                *(undefined4 *)in_R8 = *(undefined4 *)(*(long *)(local_40 + 0x18) + 4);
              }
              if (in_R9 != (undefined8 *)0x0) {
                *in_R9 = *(undefined8 *)(*(long *)(local_40 + 0x18) + 0x18);
              }
            }
            if (in_RDI->mode == '\x01') {
              internal_exr_unlock(in_RDI);
            }
          }
          else {
            if (in_RDI->mode == '\x01') {
              internal_exr_unlock(in_RDI);
            }
            local_4 = (*in_RDI->print_error)
                                (in_RDI,0x10,
                                 "\'%s\' requested type \'opaque\', but stored attributes is type \'%s\'"
                                 ,in_RDX,*(undefined8 *)(local_40 + 8),in_RDI->print_error,p_Var1);
          }
        }
        else if (in_RDI->mode == '\x01') {
          internal_exr_unlock(in_RDI);
        }
      }
    }
  }
  return local_4;
}

Assistant:

exr_result_t
exr_attr_get_user (
    exr_const_context_t ctxt,
    int                 part_index,
    const char*         name,
    const char**        type,
    int32_t*            size,
    const void**        out)
{
    ATTR_FIND_ATTR (EXR_ATTR_OPAQUE, opaque);

    if (rv == EXR_ERR_SUCCESS)
    {
        if (type) *type = attr->type_name;

        if (attr->opaque->pack_func_ptr)
        {
            if (size) *size = attr->opaque->unpacked_size;
            if (out) *out = attr->opaque->unpacked_data;
        }
        else
        {
            if (size) *size = attr->opaque->packed_alloc_size;
            if (out) *out = attr->opaque->packed_data;
        }
    }

    return EXR_UNLOCK_WRITE_AND_RETURN_PCTXT (rv);
}